

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmInstructionType anon_unknown.dwarf_aa461::GetOperationWithoutLoad(VmInstructionType cmd)

{
  VmInstructionType local_c;
  VmInstructionType cmd_local;
  
  switch(cmd) {
  case VM_INST_ADD_LOAD:
    local_c = VM_INST_ADD;
    break;
  case VM_INST_SUB_LOAD:
    local_c = VM_INST_SUB;
    break;
  case VM_INST_MUL_LOAD:
    local_c = VM_INST_MUL;
    break;
  case VM_INST_DIV_LOAD:
    local_c = VM_INST_DIV;
    break;
  case VM_INST_POW_LOAD:
    local_c = VM_INST_POW;
    break;
  case VM_INST_MOD_LOAD:
    local_c = VM_INST_MOD;
    break;
  case VM_INST_LESS_LOAD:
    local_c = VM_INST_LESS;
    break;
  case VM_INST_GREATER_LOAD:
    local_c = VM_INST_GREATER;
    break;
  case VM_INST_LESS_EQUAL_LOAD:
    local_c = VM_INST_LESS_EQUAL;
    break;
  case VM_INST_GREATER_EQUAL_LOAD:
    local_c = VM_INST_GREATER_EQUAL;
    break;
  case VM_INST_EQUAL_LOAD:
    local_c = VM_INST_EQUAL;
    break;
  case VM_INST_NOT_EQUAL_LOAD:
    local_c = VM_INST_NOT_EQUAL;
    break;
  case VM_INST_SHL_LOAD:
    local_c = VM_INST_SHL;
    break;
  case VM_INST_SHR_LOAD:
    local_c = VM_INST_SHR;
    break;
  case VM_INST_BIT_AND_LOAD:
    local_c = VM_INST_BIT_AND;
    break;
  case VM_INST_BIT_OR_LOAD:
    local_c = VM_INST_BIT_OR;
    break;
  case VM_INST_BIT_XOR_LOAD:
    local_c = VM_INST_BIT_XOR;
    break;
  default:
    __assert_fail("!\"unknown operation\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                  ,0x10d,
                  "VmInstructionType (anonymous namespace)::GetOperationWithoutLoad(VmInstructionType)"
                 );
  }
  return local_c;
}

Assistant:

VmInstructionType GetOperationWithoutLoad(VmInstructionType cmd)
	{
		switch(cmd)
		{
		case VM_INST_ADD_LOAD:
			return VM_INST_ADD;
		case VM_INST_SUB_LOAD:
			return VM_INST_SUB;
		case VM_INST_MUL_LOAD:
			return VM_INST_MUL;
		case VM_INST_DIV_LOAD:
			return VM_INST_DIV;
		case VM_INST_POW_LOAD:
			return VM_INST_POW;
		case VM_INST_MOD_LOAD:
			return VM_INST_MOD;
		case VM_INST_LESS_LOAD:
			return VM_INST_LESS;
		case VM_INST_GREATER_LOAD:
			return VM_INST_GREATER;
		case VM_INST_LESS_EQUAL_LOAD:
			return VM_INST_LESS_EQUAL;
		case VM_INST_GREATER_EQUAL_LOAD:
			return VM_INST_GREATER_EQUAL;
		case VM_INST_EQUAL_LOAD:
			return VM_INST_EQUAL;
		case VM_INST_NOT_EQUAL_LOAD:
			return VM_INST_NOT_EQUAL;
		case VM_INST_SHL_LOAD:
			return VM_INST_SHL;
		case VM_INST_SHR_LOAD:
			return VM_INST_SHR;
		case VM_INST_BIT_AND_LOAD:
			return VM_INST_BIT_AND;
		case VM_INST_BIT_OR_LOAD:
			return VM_INST_BIT_OR;
		case VM_INST_BIT_XOR_LOAD:
			return VM_INST_BIT_XOR;
		default:
			break;
		}

		assert(!"unknown operation");
		return VM_INST_ABORT_NO_RETURN;
	}